

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

Patient * __thiscall
Hospital::Entered_Patient
          (Hospital *this,string *username,string *password,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  __type _Var1;
  pointer pPVar2;
  long lVar3;
  ulong uVar4;
  string local_70;
  string local_50;
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    pPVar2 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x150) <= uVar4)
    {
      uVar4 = 0;
LAB_00115b03:
      return pPVar2 + uVar4;
    }
    Human::User_name_Getter_abi_cxx11_
              (&local_70,(Human *)((long)&(pPVar2->super_Human).Id._M_dataplus + lVar3));
    _Var1 = std::operator==(&local_70,username);
    if (_Var1) {
      Human::Password_Getter_abi_cxx11_
                (&local_50,
                 (Human *)((long)&(((All_Of_Patients->
                                    super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                                    super__Vector_impl_data._M_start)->super_Human).Id._M_dataplus +
                          lVar3));
      _Var1 = std::operator==(&local_50,password);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (_Var1) {
        pPVar2 = (All_Of_Patients->super__Vector_base<Patient,_std::allocator<Patient>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_00115b03;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_70);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x150;
  } while( true );
}

Assistant:

Patient* Hospital :: Entered_Patient(string username , string password , vector<Patient>All_Of_Patients){
    int g =0;
    for (int i = 0; i < All_Of_Patients.size(); ++i) {
        if (All_Of_Patients[i].User_name_Getter() == username && All_Of_Patients[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }

    return &All_Of_Patients[g];
}